

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_model *
rf_load_meshes_and_materials_for_model
          (rf_model *__return_storage_ptr__,rf_model model,rf_allocator allocator,
          rf_allocator temp_allocator)

{
  rf_source_location rVar1;
  rf_source_location rVar2;
  rf_source_location rVar3;
  rf_allocator_args rVar4;
  rf_allocator_args rVar5;
  rf_allocator temp_allocator_00;
  rf_allocator allocator_00;
  rf_allocator allocator_01;
  undefined1 auVar6 [24];
  rf_material *__dest;
  rf_mesh *prVar7;
  void *pvVar8;
  rf_allocator_proc *prVar9;
  uint uStack_224;
  rf_material local_208;
  undefined8 local_170;
  undefined8 local_168;
  undefined4 local_160;
  uint uStack_15c;
  char *local_158;
  char *local_150;
  undefined8 local_148;
  char *local_140;
  char *local_138;
  undefined8 local_130;
  long local_128;
  rf_int i;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  uint uStack_9c;
  char *local_98;
  char *local_90;
  undefined8 local_88;
  char *local_80;
  char *local_78;
  undefined8 local_70;
  undefined1 local_68 [64];
  void *local_28;
  rf_allocator temp_allocator_local;
  rf_allocator allocator_local;
  
  temp_allocator_local.user_data = temp_allocator.allocator_proc;
  local_28 = temp_allocator.user_data;
  prVar9 = allocator.allocator_proc;
  temp_allocator_local.allocator_proc = (rf_allocator_proc *)allocator.user_data;
  rf_mat_identity();
  memcpy(&model,local_68,0x40);
  if (model.mesh_count == 0) {
    local_80 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    local_78 = "rf_load_meshes_and_materials_for_model";
    local_70 = 0x8160;
    rf_log_impl(4,0x1b52be);
    model.mesh_count = 1;
    local_98 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    local_90 = "rf_load_meshes_and_materials_for_model";
    local_88 = 0x8163;
    local_b0 = 0;
    local_a8 = 0x70;
    local_a0 = 0;
    rVar1.proc_name = "rf_load_meshes_and_materials_for_model";
    rVar1.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar1.line_in_file = 0x8163;
    rVar4._16_8_ = (ulong)uStack_9c << 0x20;
    rVar4.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x70) << 0x40,0);
    rVar4.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x70) << 0x40,8);
    prVar7 = (rf_mesh *)
             (*prVar9)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar1,RF_AM_ALLOC,rVar4)
    ;
    model.meshes = prVar7;
    memset(prVar7,0,0x70);
    prVar7 = model.meshes;
    allocator_00.allocator_proc = prVar9;
    allocator_00.user_data = temp_allocator_local.allocator_proc;
    temp_allocator_00.allocator_proc = (rf_allocator_proc *)temp_allocator_local.user_data;
    temp_allocator_00.user_data = local_28;
    rf_gen_mesh_cube((rf_mesh *)&i,1.0,1.0,1.0,allocator_00,temp_allocator_00);
    memcpy(prVar7,&i,0x70);
  }
  else {
    for (local_128 = 0; local_128 < model.mesh_count; local_128 = local_128 + 1) {
      rf_gfx_load_mesh(model.meshes + local_128,false);
    }
  }
  if (model.material_count == 0) {
    local_140 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    local_138 = "rf_load_meshes_and_materials_for_model";
    local_130 = 0x8170;
    rf_log_impl(4,0x1b52ed);
    local_158 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    local_150 = "rf_load_meshes_and_materials_for_model";
    local_148 = 0x8173;
    local_170 = 0;
    local_168 = 0x98;
    local_160 = 0;
    rVar2.proc_name = "rf_load_meshes_and_materials_for_model";
    rVar2.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar2.line_in_file = 0x8173;
    rVar5._16_8_ = (ulong)uStack_15c << 0x20;
    rVar5.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x98) << 0x40,0);
    rVar5.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x98) << 0x40,8);
    pvVar8 = (*prVar9)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar2,RF_AM_ALLOC,rVar5)
    ;
    memset(pvVar8,0,0x98);
    __dest = model.materials;
    allocator_01.allocator_proc = prVar9;
    allocator_01.user_data = temp_allocator_local.allocator_proc;
    rf_load_default_material(&local_208,allocator_01);
    memcpy(__dest,&local_208,0x98);
    if (model.mesh_material == (int *)0x0) {
      rVar3.proc_name = "rf_load_meshes_and_materials_for_model";
      rVar3.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar3.line_in_file = 0x8179;
      auVar6._8_8_ = (ulong)uStack_224 << 0x20;
      auVar6._0_8_ = model.mesh_count << 2;
      auVar6._16_8_ = 0;
      pvVar8 = (*prVar9)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar3,RF_AM_ALLOC,
                         (rf_allocator_args)(auVar6 << 0x40));
      memset(pvVar8,0,model.mesh_count << 2);
    }
  }
  memcpy(__return_storage_ptr__,&model,0x80);
  return __return_storage_ptr__;
}

Assistant:

RF_INTERNAL rf_model rf_load_meshes_and_materials_for_model(rf_model model, rf_allocator allocator, rf_allocator temp_allocator)
{
    // Make sure model transform is set to identity matrix!
    model.transform = rf_mat_identity();

    if (model.mesh_count == 0)
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "No meshes can be loaded, default to cube mesh.");

        model.mesh_count = 1;
        model.meshes = (rf_mesh *) RF_ALLOC(allocator, sizeof(rf_mesh));
        memset(model.meshes, 0, sizeof(rf_mesh));
        model.meshes[0] = rf_gen_mesh_cube(1.0f, 1.0f, 1.0f, allocator, temp_allocator);
    }
    else
    {
        // Upload vertex data to GPU (static mesh)
        for (rf_int i = 0; i < model.mesh_count; i++)
            rf_gfx_load_mesh(&model.meshes[i], false);
    }

    if (model.material_count == 0)
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "No materials can be loaded, default to white material.");

        model.material_count = 1;
        model.materials = (rf_material *) RF_ALLOC(allocator, sizeof(rf_material));
        memset(model.materials, 0, sizeof(rf_material));
        model.materials[0] = rf_load_default_material(allocator);

        if (model.mesh_material == NULL)
        {
            model.mesh_material = (int *) RF_ALLOC(allocator, model.mesh_count * sizeof(int));
            memset(model.mesh_material, 0, model.mesh_count * sizeof(int));
        }
    }

    return model;
}